

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O0

void Ioa_WriteAiger(Aig_Man_t *pMan,char *pFileName,int fWriteSymbols,int fCompact)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  Aig_Obj_t *pAVar7;
  char *pcVar8;
  Vec_Int_t *vLits_00;
  Vec_Str_t *p;
  uchar *pBuffer_00;
  Aig_Obj_t *pAVar9;
  int local_ac;
  int Temp;
  Vec_Str_t *vBinary;
  Vec_Int_t *vLits;
  uint local_58;
  uint uLit;
  uint uLit1;
  uint uLit0;
  uchar *pBuffer;
  int Pos;
  int nBufferSize;
  int nNodes;
  int i;
  Aig_Obj_t *pDriver;
  Aig_Obj_t *pObj;
  FILE *pFile;
  int fCompact_local;
  int fWriteSymbols_local;
  char *pFileName_local;
  Aig_Man_t *pMan_local;
  
  iVar1 = Aig_ManCoNum(pMan);
  if (iVar1 == 0) {
    printf("AIG cannot be written because it has no POs.\n");
  }
  else {
    __stream = fopen(pFileName,"wb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Ioa_WriteAiger(): Cannot open the output file \"%s\".\n",pFileName);
    }
    else {
      pAVar7 = Aig_ManConst1(pMan);
      Ioa_ObjSetAigerNum(pAVar7,0);
      Pos = 1;
      for (nBufferSize = 0; iVar1 = Vec_PtrSize(pMan->vCis), nBufferSize < iVar1;
          nBufferSize = nBufferSize + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCis,nBufferSize);
        Ioa_ObjSetAigerNum(pAVar7,Pos);
        Pos = Pos + 1;
      }
      for (nBufferSize = 0; iVar1 = Vec_PtrSize(pMan->vObjs), nBufferSize < iVar1;
          nBufferSize = nBufferSize + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vObjs,nBufferSize);
        if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar7), iVar1 != 0)) {
          Ioa_ObjSetAigerNum(pAVar7,Pos);
          Pos = Pos + 1;
        }
      }
      pcVar8 = "";
      if (fCompact != 0) {
        pcVar8 = "2";
      }
      iVar1 = Aig_ManCiNum(pMan);
      iVar2 = Aig_ManNodeNum(pMan);
      iVar3 = Aig_ManCiNum(pMan);
      iVar4 = Aig_ManRegNum(pMan);
      uVar5 = Aig_ManRegNum(pMan);
      iVar6 = Aig_ManConstrNum(pMan);
      if (iVar6 == 0) {
        local_ac = Aig_ManCoNum(pMan);
        iVar6 = Aig_ManRegNum(pMan);
        local_ac = local_ac - iVar6;
      }
      else {
        local_ac = 0;
      }
      iVar6 = Aig_ManNodeNum(pMan);
      fprintf(__stream,"aig%s %u %u %u %u %u",pcVar8,(ulong)(uint)(iVar1 + iVar2),
              (ulong)(uint)(iVar3 - iVar4),(ulong)uVar5,local_ac,iVar6);
      iVar1 = Aig_ManConstrNum(pMan);
      if (iVar1 != 0) {
        iVar1 = Aig_ManCoNum(pMan);
        iVar2 = Aig_ManRegNum(pMan);
        iVar3 = Aig_ManConstrNum(pMan);
        uVar5 = Aig_ManConstrNum(pMan);
        fprintf(__stream," %u %u",(ulong)(uint)((iVar1 - iVar2) - iVar3),(ulong)uVar5);
      }
      fprintf(__stream,"\n");
      Aig_ManInvertConstraints(pMan);
      if (fCompact == 0) {
        iVar1 = Aig_ManCoNum(pMan);
        iVar2 = Aig_ManRegNum(pMan);
        for (nBufferSize = iVar1 - iVar2; iVar1 = Vec_PtrSize(pMan->vCos), nBufferSize < iVar1;
            nBufferSize = nBufferSize + 1) {
          pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,nBufferSize);
          pAVar9 = Aig_ObjFanin0(pAVar7);
          iVar1 = Ioa_ObjAigerNum(pAVar9);
          uVar5 = Aig_ObjFaninC0(pAVar7);
          iVar2 = Ioa_ObjAigerNum(pAVar9);
          uVar5 = Ioa_ObjMakeLit(iVar1,uVar5 ^ iVar2 == 0);
          fprintf(__stream,"%u\n",(ulong)uVar5);
        }
        nBufferSize = 0;
        while( true ) {
          iVar1 = Aig_ManCoNum(pMan);
          iVar2 = Aig_ManRegNum(pMan);
          if (iVar1 - iVar2 <= nBufferSize) break;
          pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,nBufferSize);
          pAVar9 = Aig_ObjFanin0(pAVar7);
          iVar1 = Ioa_ObjAigerNum(pAVar9);
          uVar5 = Aig_ObjFaninC0(pAVar7);
          iVar2 = Ioa_ObjAigerNum(pAVar9);
          uVar5 = Ioa_ObjMakeLit(iVar1,uVar5 ^ iVar2 == 0);
          fprintf(__stream,"%u\n",(ulong)uVar5);
          nBufferSize = nBufferSize + 1;
        }
      }
      else {
        vLits_00 = Ioa_WriteAigerLiterals(pMan);
        p = Ioa_WriteEncodeLiterals(vLits_00);
        pcVar8 = Vec_StrArray(p);
        iVar1 = Vec_StrSize(p);
        fwrite(pcVar8,1,(long)iVar1,__stream);
        Vec_StrFree(p);
        Vec_IntFree(vLits_00);
      }
      Aig_ManInvertConstraints(pMan);
      pBuffer._0_4_ = 0;
      iVar1 = Aig_ManNodeNum(pMan);
      iVar2 = iVar1 * 6 + 100;
      pBuffer_00 = (uchar *)malloc((long)iVar2);
      for (nBufferSize = 0; iVar3 = Vec_PtrSize(pMan->vObjs), nBufferSize < iVar3;
          nBufferSize = nBufferSize + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vObjs,nBufferSize);
        if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar7), iVar3 != 0)) {
          iVar3 = Ioa_ObjAigerNum(pAVar7);
          iVar3 = Ioa_ObjMakeLit(iVar3,0);
          pAVar9 = Aig_ObjFanin0(pAVar7);
          iVar4 = Ioa_ObjAigerNum(pAVar9);
          iVar6 = Aig_ObjFaninC0(pAVar7);
          uLit = Ioa_ObjMakeLit(iVar4,iVar6);
          pAVar9 = Aig_ObjFanin1(pAVar7);
          iVar4 = Ioa_ObjAigerNum(pAVar9);
          iVar6 = Aig_ObjFaninC1(pAVar7);
          uVar5 = Ioa_ObjMakeLit(iVar4,iVar6);
          if (uLit == uVar5) {
            __assert_fail("uLit0 != uLit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ioa/ioaWriteAig.c"
                          ,0x21c,"void Ioa_WriteAiger(Aig_Man_t *, char *, int, int)");
          }
          local_58 = uVar5;
          if (uVar5 < uLit) {
            local_58 = uLit;
            uLit = uVar5;
          }
          iVar3 = Ioa_WriteAigerEncode(pBuffer_00,(int)pBuffer,iVar3 - local_58);
          pBuffer._0_4_ = Ioa_WriteAigerEncode(pBuffer_00,iVar3,local_58 - uLit);
          if (iVar1 * 6 + 0x5a < (int)pBuffer) {
            printf(
                  "Ioa_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n"
                  );
            fclose(__stream);
            return;
          }
        }
      }
      if (iVar2 <= (int)pBuffer) {
        __assert_fail("Pos < nBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ioa/ioaWriteAig.c"
                      ,0x22c,"void Ioa_WriteAiger(Aig_Man_t *, char *, int, int)");
      }
      fwrite(pBuffer_00,1,(long)(int)pBuffer,__stream);
      if (pBuffer_00 != (uchar *)0x0) {
        free(pBuffer_00);
      }
      fprintf(__stream,"c");
      if (pMan->pName != (char *)0x0) {
        fprintf(__stream,"n%s%c",pMan->pName,0);
      }
      pcVar8 = Ioa_TimeStamp();
      fprintf(__stream,"\nThis file was produced by the IOA package in ABC on %s\n",pcVar8);
      fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger"
             );
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact )
{
//    Bar_Progress_t * pProgress;
    FILE * pFile;
    Aig_Obj_t * pObj, * pDriver;
    int i, nNodes, nBufferSize, Pos;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    if ( Aig_ManCoNum(pMan) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }

//    assert( Aig_ManIsStrash(pMan) );
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Ioa_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
/*
    Aig_ManForEachLatch( pMan, pObj, i )
        if ( !Aig_LatchIsInit0(pObj) )
        {
            fprintf( stdout, "Ioa_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n" );
            return;
        }
*/
    // set the node numbers to be used in the output file
    nNodes = 0;
    Ioa_ObjSetAigerNum( Aig_ManConst1(pMan), nNodes++ );
    Aig_ManForEachCi( pMan, pObj, i )
        Ioa_ObjSetAigerNum( pObj, nNodes++ );
    Aig_ManForEachNode( pMan, pObj, i )
        Ioa_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Aig_ManCiNum(pMan) + Aig_ManNodeNum(pMan), 
        Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan),
        Aig_ManRegNum(pMan),
        Aig_ManConstrNum(pMan) ? 0 : Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan),
        Aig_ManNodeNum(pMan) );
    // write the extended header "B C J F"
    if ( Aig_ManConstrNum(pMan) )
        fprintf( pFile, " %u %u", Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) - Aig_ManConstrNum(pMan), Aig_ManConstrNum(pMan) );
    fprintf( pFile, "\n" ); 

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    Aig_ManInvertConstraints( pMan );
    if ( !fCompact ) 
    {
        // write latch drivers
        Aig_ManForEachLiSeq( pMan, pObj, i )
        {
            pDriver = Aig_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
        }

        // write PO drivers
        Aig_ManForEachPoSeq( pMan, pObj, i )
        {
            pDriver = Aig_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
        }
    }
    else
    {
        Vec_Int_t * vLits = Ioa_WriteAigerLiterals( pMan );
        Vec_Str_t * vBinary = Ioa_WriteEncodeLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Aig_ManInvertConstraints( pMan );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Aig_ManNodeNum(pMan) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
//    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(pMan) );
    Aig_ManForEachNode( pMan, pObj, i )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        uLit  = Ioa_ObjMakeLit( Ioa_ObjAigerNum(pObj), 0 );
        uLit0 = Ioa_ObjMakeLit( Ioa_ObjAigerNum(Aig_ObjFanin0(pObj)), Aig_ObjFaninC0(pObj) );
        uLit1 = Ioa_ObjMakeLit( Ioa_ObjAigerNum(Aig_ObjFanin1(pObj)), Aig_ObjFaninC1(pObj) );
        assert( uLit0 != uLit1 );
        if ( uLit0 > uLit1 )
        {
            int Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        Pos = Ioa_WriteAigerEncode( pBuffer, Pos, uLit  - uLit1 );
        Pos = Ioa_WriteAigerEncode( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Ioa_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
            fclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
//    Bar_ProgressStop( pProgress );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );
/*
    // write the symbol table
    if ( fWriteSymbols )
    {
        int bads;
        // write PIs
        Aig_ManForEachPiSeq( pMan, pObj, i )
            fprintf( pFile, "i%d %s\n", i, Aig_ObjName(pObj) );
        // write latches
        Aig_ManForEachLoSeq( pMan, pObj, i )
            fprintf( pFile, "l%d %s\n", i, Aig_ObjName(Aig_ObjFanout0(pObj)) );
        // write POs
        bads = Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) - Aig_ManConstrNum(pMan);
        Aig_ManForEachPoSeq( pMan, pObj, i )
            if ( !Aig_ManConstrNum(pMan) )
                fprintf( pFile, "o%d %s\n", i, Aig_ObjName(pObj) );
            else if ( i < bads )
                fprintf( pFile, "b%d %s\n", i, Aig_ObjName(pObj) );
            else
                fprintf( pFile, "c%d %s\n", i - bads, Aig_ObjName(pObj) );
    }
*/
    // write the comment
    fprintf( pFile, "c" );
    if ( pMan->pName )
        fprintf( pFile, "n%s%c", pMan->pName, '\0' );
    fprintf( pFile, "\nThis file was produced by the IOA package in ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
}